

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * ot::commissioner::Interpreter::Usage(string *__return_storage_ptr__,Expression *aExpr)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  bool bVar1;
  size_type sVar2;
  reference __x;
  pointer ppVar3;
  allocator local_31;
  _Self local_30;
  _Self local_28;
  const_iterator usage;
  bool condition;
  Expression *aExpr_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(aExpr);
  this = mUsageMap_abi_cxx11_;
  usage._M_node._7_1_ = sVar2 != 0;
  if (!(bool)usage._M_node._7_1_) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter.cpp"
                  ,0xa97,"static const std::string ot::commissioner::Interpreter::Usage(Expression)"
                 );
  }
  __x = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](aExpr,0);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(this,__x);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(mUsageMap_abi_cxx11_);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Interpreter::Usage(Expression aExpr)
{
    ASSERT(aExpr.size() >= 1);
    auto usage = mUsageMap.find(aExpr[0]);
    return usage != mUsageMap.end() ? usage->second : "";
}